

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::Run
          (CommandLineInterfaceTest *this,string *command)

{
  string_view command_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *command_local;
  CommandLineInterfaceTest *this_local;
  
  local_18 = command;
  command_local = (string *)this;
  if ((this->disallow_plugins_ & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"prefix-",&local_39);
    CommandLineInterfaceTester::AllowPlugins(&this->super_CommandLineInterfaceTester,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80," ");
    compiler::(anonymous_namespace)::CreatePluginArg_abi_cxx11_();
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_b0,&local_d0);
    absl::lts_20250127::StrAppend(command,&local_80,&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  command_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)command);
  CommandLineInterfaceTester::RunProtoc(&this->super_CommandLineInterfaceTester,command_00);
  return;
}

Assistant:

void CommandLineInterfaceTest::Run(std::string command) {
  if (!disallow_plugins_) {
    AllowPlugins("prefix-");
    absl::StrAppend(&command, " ", CreatePluginArg());
  }

  RunProtoc(command);
}